

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *lhs;
  int vert_start_idx_00;
  int vert_end_idx_00;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  uint col_upr_left;
  uint col_00;
  ImU32 col_upr_right;
  ImU32 col_01;
  ImGuiWindow *pIVar4;
  ImGuiStyle *pIVar5;
  float fVar6;
  float _x;
  float fVar7;
  float _x_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_4b0;
  float local_41c;
  float local_400;
  float local_3f8;
  byte local_3e9;
  float local_3e8;
  float local_3e4;
  float local_3dc;
  float local_3d4;
  float local_3cc;
  float local_3b8;
  byte local_379;
  uint local_378;
  uint local_374;
  ImVec2 local_370;
  ImVec2 local_368;
  ImVec2 local_360;
  ImVec2 local_358;
  float local_34c;
  ImVec2 IStack_348;
  float bar1_line_y;
  ImVec2 local_340;
  ImVec2 local_338;
  undefined1 local_330 [8];
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  ImVec2 local_310;
  ImVec2 local_308;
  ImVec2 local_300;
  float local_2f8;
  float bar0_line_y;
  ImVec2 local_2ec;
  int local_2e4;
  int i;
  ImVec2 local_2d8;
  ImVec2 local_2d0;
  ImVec2 local_2c8;
  ImVec2 local_2c0;
  ImVec2 local_2b8;
  ImVec2 local_2b0;
  ImVec2 local_2a8;
  ImVec2 local_2a0;
  ImVec2 local_298;
  ImVec2 uv_white;
  ImVec2 local_288;
  ImVec2 trc;
  ImVec2 local_278;
  ImVec2 trb;
  ImVec2 local_268;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 local_234;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 user_col32_striped_of_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  ImU32 col_hues [7];
  ImU32 col_midgrey;
  ImU32 col_white;
  ImU32 col_black;
  int style_alpha8;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward_1;
  bool value_changed_fix_hue_wrap;
  undefined1 local_18c [8];
  ImVec4 ref_col_v4;
  undefined1 local_170 [4];
  ImGuiColorEditFlags sub_flags_to_forward;
  ImVec4 col_v4;
  char *label_display_end;
  ImVec2 local_14c;
  ImVec2 local_144;
  ImVec2 local_13c;
  ImVec2 local_134;
  float local_12c;
  float local_128;
  float ww;
  float vv;
  float uu;
  ImVec2 local_118;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  bool local_e3;
  bool local_e2;
  bool local_e1;
  float local_e0;
  bool value_changed_sv;
  bool value_changed_h;
  float fStack_dc;
  bool value_changed;
  float B;
  float G;
  float R;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  float width;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *ref_col_local;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar1 = GImGui;
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) != 0) {
    return false;
  }
  this = pIVar4->DrawList;
  pIVar5 = &pIVar1->Style;
  fVar6 = CalcItemWidth();
  ImGuiNextItemData::ClearFlags(&pIVar1->NextItemData);
  PushID(label);
  BeginGroup();
  ref_col_local._4_4_ = flags;
  if ((flags & 0x100U) == 0) {
    ref_col_local._4_4_ = flags | 0x10;
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ColorPickerOptionsPopup(col,ref_col_local._4_4_);
  }
  if ((ref_col_local._4_4_ & 0x6000000) == 0) {
    if ((pIVar1->ColorEditOptions & 0x6000000U) == 0) {
      local_374 = 0xa900000;
    }
    else {
      local_374 = pIVar1->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_374 & 0x6000000 | ref_col_local._4_4_;
  }
  if ((ref_col_local._4_4_ & 0x18000000) == 0) {
    if ((pIVar1->ColorEditOptions & 0x18000000U) == 0) {
      local_378 = 0xa900000;
    }
    else {
      local_378 = pIVar1->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_378 & 0x18000000 | ref_col_local._4_4_;
  }
  bVar2 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x6000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1183,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  bVar2 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x18000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1184,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ref_col_local._4_4_ = pIVar1->ColorEditOptions & 0x10000U | ref_col_local._4_4_;
  }
  picker_pos.y = 5.60519e-45;
  if ((ref_col_local._4_4_ & 2) != 0) {
    picker_pos.y = 4.2039e-45;
  }
  local_379 = 0;
  if ((ref_col_local._4_4_ & 0x10000) != 0) {
    local_379 = (ref_col_local._4_4_ & 2) != 0 ^ 0xff;
  }
  picker_pos.x._3_1_ = local_379 & 1;
  _bars_width = (pIVar4->DC).CursorPos;
  _x = GetFrameHeight();
  iVar3 = 1;
  if ((picker_pos.x._3_1_ & 1) != 0) {
    iVar3 = 2;
  }
  fVar6 = ImMax<float>(_x * 1.0,-(float)iVar3 * (_x + (pIVar1->Style).ItemInnerSpacing.x) + fVar6);
  fVar7 = bars_width + fVar6 + (pIVar1->Style).ItemInnerSpacing.x;
  _x_00 = fVar7 + _x + (pIVar1->Style).ItemInnerSpacing.x;
  backup_initial_col[3] = (float)(int)(_x * 0.2);
  memcpy(&wheel_r_outer,col,(long)(int)picker_pos.y << 2);
  local_41c = fVar6 * 0.08;
  fVar8 = fVar6 * 0.5;
  fVar9 = fVar8 - local_41c;
  ImVec2::ImVec2((ImVec2 *)&triangle_pa.y,(fVar6 + _x) * 0.5 + bars_width,fVar6 * 0.5 + square_sz);
  triangle_pa.x = fVar9 - (float)(int)(fVar6 * 0.027);
  ImVec2::ImVec2(&triangle_pb,triangle_pa.x,0.0);
  ImVec2::ImVec2(&triangle_pc,triangle_pa.x * -0.5,triangle_pa.x * -0.866025);
  ImVec2::ImVec2((ImVec2 *)&S,triangle_pa.x * -0.5,triangle_pa.x * 0.866025);
  V = *col;
  R = col[1];
  G = col[2];
  B = *col;
  fStack_dc = col[1];
  local_e0 = col[2];
  if ((ref_col_local._4_4_ & 0x8000000) == 0) {
    if ((ref_col_local._4_4_ & 0x10000000) != 0) {
      ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
    }
  }
  else {
    ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
    if (((R == 0.0) && (!NAN(R))) &&
       (iVar3 = memcmp(pIVar1->ColorEditLastColor,col,0xc), iVar3 == 0)) {
      V = pIVar1->ColorEditLastHue;
    }
  }
  local_e1 = false;
  local_e2 = false;
  local_e3 = false;
  PushItemFlag(8,true);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_134,fVar6,fVar6);
      InvisibleButton("sv",&local_134);
      local_e3 = IsItemActive();
      if (local_e3) {
        R = ImSaturate(((pIVar1->IO).MousePos.x - bars_width) / (fVar6 - 1.0));
        fVar10 = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar6 - 1.0));
        G = 1.0 - fVar10;
      }
      if ((ref_col_local._4_4_ & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      ImVec2::ImVec2(&local_13c,fVar7,square_sz);
      SetCursorScreenPos(&local_13c);
      ImVec2::ImVec2(&local_144,_x,fVar6);
      InvisibleButton("hue",&local_144);
      local_e2 = IsItemActive();
      local_e1 = local_e3;
      if (local_e2) {
        V = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar6 - 1.0));
        local_e1 = true;
      }
    }
  }
  else {
    ImVec2::ImVec2(&initial_off,fVar6 + (pIVar1->Style).ItemInnerSpacing.x + _x,fVar6);
    InvisibleButton("hsv",&initial_off);
    bVar2 = IsItemActive();
    if (bVar2) {
      current_off = ::operator-((pIVar1->IO).MouseClickedPos,(ImVec2 *)&triangle_pa.y);
      _cos_hue_angle = ::operator-(&(pIVar1->IO).MousePos,(ImVec2 *)&triangle_pa.y);
      fVar10 = ImLengthSqr(&current_off);
      if (((fVar9 - 1.0) * (fVar9 - 1.0) <= fVar10) && (fVar10 <= (fVar8 + 1.0) * (fVar8 + 1.0))) {
        fVar10 = ImAtan2(initial_dist2,cos_hue_angle);
        V = (fVar10 / 3.1415927) * 0.5;
        if (V < 0.0) {
          V = V + 1.0;
        }
        local_e2 = true;
        local_e1 = true;
      }
      fVar10 = ImCos((-V - V) * 3.1415927);
      fVar11 = ImSin((-V - V) * 3.1415927);
      current_off_unrotated = ImRotate(&current_off,fVar10,fVar11);
      bVar2 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&current_off_unrotated)
      ;
      if (bVar2) {
        local_118 = ImRotate((ImVec2 *)&cos_hue_angle,fVar10,fVar11);
        bVar2 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
        if (!bVar2) {
          _vv = ImTriangleClosestPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
          local_118 = _vv;
        }
        ImTriangleBarycentricCoords
                  (&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118,&ww,&local_128,&local_12c);
        G = ImClamp<float>(1.0 - local_128,0.0001,1.0);
        R = ImClamp<float>(ww / G,0.0001,1.0);
        local_e3 = true;
        local_e1 = true;
      }
    }
    if ((ref_col_local._4_4_ & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  if ((picker_pos.x._3_1_ & 1) != 0) {
    ImVec2::ImVec2(&local_14c,_x_00,square_sz);
    SetCursorScreenPos(&local_14c);
    ImVec2::ImVec2((ImVec2 *)((long)&label_display_end + 4),_x,fVar6);
    InvisibleButton("alpha",(ImVec2 *)((long)&label_display_end + 4));
    bVar2 = IsItemActive();
    if (bVar2) {
      fVar10 = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar6 - 1.0));
      col[3] = 1.0 - fVar10;
      local_e1 = true;
    }
  }
  PopItemFlag();
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (((ref_col_local._4_4_ & 0x80) == 0) &&
     (col_v4._8_8_ = FindRenderedTextEnd(label,(char *)0x0), label != (char *)col_v4._8_8_)) {
    if ((ref_col_local._4_4_ & 0x100) != 0) {
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    }
    TextEx(label,(char *)col_v4._8_8_,0);
  }
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    PushItemFlag(0x10,true);
    if ((ref_col_local._4_4_ & 2) == 0) {
      local_3b8 = col[3];
    }
    else {
      local_3b8 = 1.0;
    }
    ImVec4::ImVec4((ImVec4 *)local_170,*col,col[1],col[2],local_3b8);
    if ((ref_col_local._4_4_ & 0x80) != 0) {
      Text("Current");
    }
    ImVec2::ImVec2((ImVec2 *)&ref_col_v4.z,_x * 3.0,_x + _x);
    ColorButton("##current",(ImVec4 *)local_170,ref_col_local._4_4_ & 0x180e0040,
                (ImVec2)ref_col_v4._8_8_);
    if (ref_col != (float *)0x0) {
      Text("Original");
      if ((ref_col_local._4_4_ & 2) == 0) {
        local_3cc = ref_col[3];
      }
      else {
        local_3cc = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)local_18c,*ref_col,ref_col[1],ref_col[2],local_3cc);
      ImVec2::ImVec2((ImVec2 *)&sub_flags_to_forward_1,_x * 3.0,_x + _x);
      bVar2 = ColorButton("##original",(ImVec4 *)local_18c,ref_col_local._4_4_ & 0x180e0040,
                          _sub_flags_to_forward_1);
      if (bVar2) {
        memcpy(col,ref_col,(long)(int)picker_pos.y << 2);
        local_e1 = true;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if ((local_e2 != false) || (local_e3 != false)) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        *col = V;
        col[1] = R;
        col[2] = G;
      }
    }
    else {
      if (V < 1.0) {
        local_3d4 = V;
      }
      else {
        local_3d4 = V - 1e-05;
      }
      if (R <= 0.0) {
        local_3dc = 1e-05;
      }
      else {
        local_3dc = R;
      }
      if (G <= 0.0) {
        local_3e4 = 1e-06;
      }
      else {
        local_3e4 = G;
      }
      ColorConvertHSVtoRGB(local_3d4,local_3dc,local_3e4,col,col + 1,col + 2);
      pIVar1->ColorEditLastHue = V;
      *(undefined8 *)pIVar1->ColorEditLastColor = *(undefined8 *)col;
      pIVar1->ColorEditLastColor[2] = col[2];
    }
  }
  sub_flags._3_1_ = 0;
  if ((ref_col_local._4_4_ & 0x20) == 0) {
    local_3e8 = fVar7;
    if ((picker_pos.x._3_1_ & 1) != 0) {
      local_3e8 = _x_00;
    }
    PushItemWidth((local_3e8 + _x) - bars_width);
    new_H = 1.4682497e-23;
    new_S = (float)(ref_col_local._4_4_ & 0x198e001a | 4);
    if ((((ref_col_local._4_4_ & 0x100000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) &&
       (bVar2 = ColorEdit4("##rgb",col,ref_col_local._4_4_ & 0x198e001a | 0x100004), bVar2)) {
      local_3e9 = 0;
      if (pIVar1->ActiveId != 0) {
        local_3e9 = pIVar1->ActiveIdAllowOverlap ^ 0xff;
      }
      sub_flags._3_1_ = local_3e9 & 1;
      local_e1 = true;
    }
    if (((ref_col_local._4_4_ & 0x200000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar2 = ColorEdit4("##hsv",col,(uint)new_S | 0x200000);
      local_e1 = local_e1 != false || bVar2;
    }
    if (((ref_col_local._4_4_ & 0x400000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar2 = ColorEdit4("##hex",col,(uint)new_S | 0x400000);
      local_e1 = local_e1 != false || bVar2;
    }
    PopItemWidth();
  }
  if (((((sub_flags._3_1_ & 1) != 0) && ((ref_col_local._4_4_ & 0x8000000) != 0)) &&
      (ColorConvertRGBtoHSV(*col,col[1],col[2],&new_V,(float *)&style_alpha8,(float *)&col_black),
      new_V <= 0.0)) && (0.0 < V)) {
    if ((float)col_black <= 0.0) {
      if ((G != (float)col_black) || (NAN(G) || NAN((float)col_black))) {
        if (0.0 < (float)col_black) {
          local_3f8 = (float)col_black;
        }
        else {
          local_3f8 = G * 0.5;
        }
        ColorConvertHSVtoRGB(V,R,local_3f8,col,col + 1,col + 2);
        goto LAB_00494fd9;
      }
    }
    if ((float)style_alpha8 <= 0.0) {
      if (0.0 < (float)style_alpha8) {
        local_400 = (float)style_alpha8;
      }
      else {
        local_400 = R * 0.5;
      }
      ColorConvertHSVtoRGB(V,local_400,(float)col_black,col,col + 1,col + 2);
    }
  }
LAB_00494fd9:
  if (local_e1 != false) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        V = *col;
        R = col[1];
        G = col[2];
        ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
      }
    }
    else {
      B = *col;
      fStack_dc = col[1];
      local_e0 = col[2];
      ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
      if (((R == 0.0) && (!NAN(R))) &&
         (iVar3 = memcmp(pIVar1->ColorEditLastColor,col,0xc), iVar3 == 0)) {
        V = pIVar1->ColorEditLastHue;
      }
    }
  }
  fVar10 = ImSaturate(pIVar5->Alpha);
  iVar3 = (int)(fVar10 * 255.0 + 0.5);
  col_upr_left = iVar3 << 0x18 | 0xffffff;
  col_00 = iVar3 << 0x18 | 0x808080;
  hue_color_f.z = (float)(iVar3 << 0x18 | 0xff);
  hue_color_f.w = (float)(iVar3 << 0x18 | 0xffff);
  ImVec4::ImVec4((ImVec4 *)&user_col32_striped_of_alpha,1.0,1.0,1.0,pIVar5->Alpha);
  ColorConvertHSVtoRGB
            (V,1.0,1.0,(float *)&user_col32_striped_of_alpha,(float *)&hue_color32,&hue_color_f.x);
  col_upr_right = ColorConvertFloat4ToU32((ImVec4 *)&user_col32_striped_of_alpha);
  ImVec4::ImVec4((ImVec4 *)&sv_cursor_pos,B,fStack_dc,local_e0,pIVar5->Alpha);
  col_01 = ColorConvertFloat4ToU32((ImVec4 *)&sv_cursor_pos);
  ImVec2::ImVec2((ImVec2 *)&segment_per_arc);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_2b8,fVar6,fVar6);
      local_2b0 = ::operator+((ImVec2 *)&bars_width,&local_2b8);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_2b0,col_upr_left,col_upr_right,col_upr_right,
                 iVar3 << 0x18 | 0xffffff);
      ImVec2::ImVec2(&local_2c8,fVar6,fVar6);
      local_2c0 = ::operator+((ImVec2 *)&bars_width,&local_2c8);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_2c0,0,0,iVar3 << 0x18,iVar3 << 0x18);
      local_2d0 = _bars_width;
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd20,fVar6,fVar6);
      local_2d8 = ::operator+((ImVec2 *)&bars_width,(ImVec2 *)&stack0xfffffffffffffd20);
      RenderFrameBorder(local_2d0,local_2d8,0.0);
      fVar8 = bars_width;
      fVar9 = ImSaturate(R);
      segment_per_arc =
           (int)ImClamp<float>((float)(int)(fVar9 * fVar6 + fVar8 + 0.5),bars_width + 2.0,
                               (bars_width + fVar6) - 2.0);
      fVar8 = square_sz;
      fVar9 = ImSaturate(1.0 - G);
      fVar8 = ImClamp<float>((float)(int)(fVar9 * fVar6 + fVar8 + 0.5),square_sz + 2.0,
                             (square_sz + fVar6) - 2.0);
      aeps = fVar8;
      for (local_2e4 = 0; local_2e4 < 6; local_2e4 = local_2e4 + 1) {
        ImVec2::ImVec2(&local_2ec,fVar7,(float)local_2e4 * (fVar6 / 6.0) + square_sz);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd0c,fVar7 + _x,
                       (float)(local_2e4 + 1) * (fVar6 / 6.0) + square_sz);
        ImDrawList::AddRectFilledMultiColor
                  (this,&local_2ec,(ImVec2 *)&stack0xfffffffffffffd0c,col_hues[(long)local_2e4 + -2]
                   ,col_hues[(long)local_2e4 + -2],col_hues[(long)(local_2e4 + 1) + -2],
                   col_hues[(long)(local_2e4 + 1) + -2]);
      }
      local_2f8 = (float)(int)(V * fVar6 + square_sz + 0.5);
      ImVec2::ImVec2(&local_300,fVar7,square_sz);
      ImVec2::ImVec2(&local_308,fVar7 + _x,square_sz + fVar6);
      RenderFrameBorder(local_300,local_308,0.0);
      ImVec2::ImVec2(&local_310,fVar7 - 1.0,local_2f8);
      ImVec2::ImVec2((ImVec2 *)&alpha,backup_initial_col[3] + 1.0,backup_initial_col[3]);
      RenderArrowsForVerticalBar(this,local_310,_alpha,_x + 2.0,pIVar5->Alpha);
    }
  }
  else {
    iVar3 = ImMax<int>(4,(int)fVar8 / 0xc);
    for (a1 = 0.0; (int)a1 < 6; a1 = (float)((int)a1 + 1)) {
      fVar10 = ((float)(int)a1 / 6.0 + (float)(int)a1 / 6.0) * 3.1415927 - 0.5 / fVar8;
      fVar7 = ((float)(int)a1 + 1.0) / 6.0;
      fVar11 = (fVar7 + fVar7) * 3.1415927 + 0.5 / fVar8;
      vert_start_idx_00 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,(ImVec2 *)&triangle_pa.y,(fVar9 + fVar8) * 0.5,fVar10,fVar11,iVar3)
      ;
      ImDrawList::PathStroke(this,col_upr_left,false,local_41c);
      fVar7 = triangle_pa.y;
      vert_end_idx_00 = (this->VtxBuffer).Size;
      fVar12 = ImCos(fVar10);
      fVar10 = ImSin(fVar10);
      ImVec2::ImVec2(&gradient_p1,fVar12 * fVar9 + fVar7,fVar10 * fVar9 + triangle_r);
      fVar7 = triangle_pa.y;
      fVar10 = ImCos(fVar11);
      fVar11 = ImSin(fVar11);
      ImVec2::ImVec2(&local_234,fVar10 * fVar9 + fVar7,fVar11 * fVar9 + triangle_r);
      ShadeVertsLinearColorGradientKeepAlpha
                (this,vert_start_idx_00,vert_end_idx_00,gradient_p1,local_234,
                 col_hues[(long)(int)a1 + -2],col_hues[(long)(int)a1 + -1]);
    }
    hue_cursor_pos.y = ImCos(V * 2.0 * 3.1415927);
    hue_cursor_pos.x = ImSin(V * 2.0 * 3.1415927);
    ImVec2::ImVec2((ImVec2 *)&hue_cursor_segments,
                   hue_cursor_pos.y * (fVar9 + fVar8) * 0.5 + triangle_pa.y,
                   hue_cursor_pos.x * (fVar9 + fVar8) * 0.5 + triangle_r);
    if (local_e2 == false) {
      local_41c = local_41c * 0.55;
    }
    else {
      local_41c = local_41c * 0.65;
    }
    tra.y = local_41c;
    tra.x = (float)ImClamp<int>((int)(local_41c / 1.4),9,0x20);
    ImDrawList::AddCircleFilled(this,(ImVec2 *)&hue_cursor_segments,tra.y,col_upr_right,(int)tra.x);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y + 1.0,col_00,(int)tra.x,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y,col_upr_left,(int)tra.x,1.0);
    trb = ImRotate(&triangle_pb,hue_cursor_pos.y,hue_cursor_pos.x);
    lhs = &triangle_pa.y;
    local_268 = ::operator+((ImVec2 *)lhs,&trb);
    trc = ImRotate(&triangle_pc,hue_cursor_pos.y,hue_cursor_pos.x);
    local_278 = ::operator+((ImVec2 *)lhs,&trc);
    uv_white = ImRotate((ImVec2 *)&S,hue_cursor_pos.y,hue_cursor_pos.x);
    local_288 = ::operator+((ImVec2 *)lhs,&uv_white);
    local_298 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(this,6,6);
    ImDrawList::PrimVtx(this,&local_268,&local_298,col_upr_right);
    ImDrawList::PrimVtx(this,&local_278,&local_298,col_upr_right);
    ImDrawList::PrimVtx(this,&local_288,&local_298,col_upr_left);
    ImDrawList::PrimVtx(this,&local_268,&local_298,0);
    ImDrawList::PrimVtx(this,&local_278,&local_298,col_upr_left);
    ImDrawList::PrimVtx(this,&local_288,&local_298,0);
    ImDrawList::AddTriangle(this,&local_268,&local_278,&local_288,col_00,1.5);
    fVar7 = ImSaturate(R);
    local_2a8 = ImLerp(&local_288,&local_268,fVar7);
    fVar7 = ImSaturate(1.0 - G);
    local_2a0 = ImLerp(&local_2a8,&local_278,fVar7);
    _segment_per_arc = local_2a0;
  }
  local_4b0 = 10.0;
  if (local_e3 == false) {
    local_4b0 = 6.0;
  }
  bar1_bb.Max.y = local_4b0;
  ImDrawList::AddCircleFilled(this,(ImVec2 *)&segment_per_arc,local_4b0,col_01,0xc);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y + 1.0,col_00,0xc,1.0);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y,col_upr_left,0xc,1.0);
  if ((picker_pos.x._3_1_ & 1) != 0) {
    bar1_bb.Max.x = ImSaturate(col[3]);
    ImRect::ImRect((ImRect *)local_330,_x_00,square_sz,_x_00 + _x,square_sz + fVar6);
    local_338.x = (float)local_330._0_4_;
    local_338.y = (float)local_330._4_4_;
    local_340 = bar1_bb.Min;
    fVar7 = ImRect::GetWidth((ImRect *)local_330);
    ImVec2::ImVec2(&stack0xfffffffffffffcb8,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard(local_338,local_340,0,fVar7 * 0.5,IStack_348,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_330,&bar1_bb.Min,col_01,col_01,col_01 & 0xffffff,
               col_01 & 0xffffff);
    local_34c = (float)(int)((1.0 - bar1_bb.Max.x) * fVar6 + square_sz + 0.5);
    local_358.x = (float)local_330._0_4_;
    local_358.y = (float)local_330._4_4_;
    local_360 = bar1_bb.Min;
    RenderFrameBorder((ImVec2)local_330,bar1_bb.Min,0.0);
    ImVec2::ImVec2(&local_368,_x_00 - 1.0,local_34c);
    ImVec2::ImVec2(&local_370,backup_initial_col[3] + 1.0,backup_initial_col[3]);
    RenderArrowsForVerticalBar(this,local_368,local_370,_x + 2.0,pIVar5->Alpha);
  }
  EndGroup();
  if ((local_e1 != false) &&
     (iVar3 = memcmp(&wheel_r_outer,col,(long)(int)picker_pos.y << 2), iVar3 == 0)) {
    local_e1 = false;
  }
  if (local_e1 != false) {
    MarkItemEdited((pIVar4->DC).LastItemId);
  }
  PopID();
  return local_e1;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
            H = g.ColorEditLastHue;
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
                H = g.ColorEditLastHue;
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_white);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}